

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_set.h
# Opt level: O3

void __thiscall duckdb_re2::SparseSetT<void>::SparseSetT(SparseSetT<void> *this,int max_size)

{
  uint uVar1;
  int *piVar2;
  new_allocator<int> local_1a;
  new_allocator<int> local_19;
  
  this->size_ = 0;
  piVar2 = __gnu_cxx::new_allocator<int>::allocate(&local_1a,(long)max_size,(void *)0x0);
  (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
  super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
  super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false> =
       (_Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>)max_size;
  (this->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar2;
  piVar2 = __gnu_cxx::new_allocator<int>::allocate(&local_19,(long)max_size,(void *)0x0);
  (this->dense_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
  super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
  super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false> =
       (_Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>)max_size;
  (this->dense_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
  super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
  super__Head_base<0UL,_int_*,_false>._M_head_impl = piVar2;
  uVar1 = this->size_;
  if ((int)uVar1 < max_size) {
    switchD_00569a20::default
              ((this->sparse_).ptr_._M_t.
               super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
               super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl + (int)uVar1,0xab,
               (ulong)(~uVar1 + max_size) * 4 + 4);
  }
  return;
}

Assistant:

SparseSetT<Value>::SparseSetT(int max_size) :
    sparse_(max_size), dense_(max_size) {
  MaybeInitializeMemory(size_, max_size);
  DebugCheckInvariants();
}